

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall
Tokenizer::registerReplacement
          (Tokenizer *this,Identifier *identifier,vector<Token,_std::allocator<Token>_> *tokens)

{
  Replacement replacement;
  value_type vStack_48;
  
  std::__cxx11::string::string((string *)&vStack_48,(string *)identifier);
  std::vector<Token,_std::allocator<Token>_>::vector(&vStack_48.value,tokens);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,&vStack_48);
  Replacement::~Replacement(&vStack_48);
  return;
}

Assistant:

void Tokenizer::registerReplacement(const Identifier& identifier, std::vector<Token>& tokens)
{
	Replacement replacement { identifier, tokens };
	replacements.push_back(replacement);
}